

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O1

span<int,_2UL> __thiscall
nonstd::span_lite::span<int,18446744073709551615ul>::subspan<1ul,2ul>
          (span<int,18446744073709551615ul> *this)

{
  logic_error *this_00;
  span<int,_2UL> sVar1;
  undefined **local_20 [2];
  
  if (2 < *(ulong *)(this + 8)) {
    sVar1.data_ = (pointer)(*(long *)this + 4);
    sVar1.size_ = 2;
    return sVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            ((logic_error *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1181: Precondition violation."
            );
  local_20[0] = &PTR__logic_error_0020eb38;
  std::logic_error::logic_error(this_00,(logic_error *)local_20);
  *(undefined ***)this_00 = &PTR__logic_error_0020eb38;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr_exp span< element_type, Count >
    subspan() const
    {
        span_EXPECTS(
            ( detail::is_positive( Offset ) && Offset <= size() ) &&
            ( Count == dynamic_extent || (detail::is_positive( Count ) && Count + Offset <= size()) )
        );

        return span< element_type, Count >(
            data() + Offset, Count != dynamic_extent ? Count : (Extent != dynamic_extent ? Extent - Offset : size() - Offset) );
    }